

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O1

bool __thiscall Key_Store_Data::operator==(Key_Store_Data *this,Am_Wrapper *test_value)

{
  Am_ID_Tag AVar1;
  int iVar2;
  bool bVar3;
  
  AVar1 = id;
  iVar2 = (**(test_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(test_value);
  if (AVar1 == (Am_ID_Tag)iVar2) {
    if (test_value == &this->super_Am_Wrapper) {
      bVar3 = true;
    }
    else {
      bVar3 = *(short *)&test_value->field_0xc == *(short *)&(this->super_Am_Wrapper).field_0xc;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static Am_Value
same_as_procedure(Am_Object &self)
{
  Am_Value value;
  Key_Store_Data *store =
      (Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = self.Get(store->key);
  store->Release();
  return value;
}